

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QToolBarAreaLayoutLine>::data(QList<QToolBarAreaLayoutLine> *this)

{
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_00;
  QToolBarAreaLayoutLine *pQVar1;
  QArrayDataPointer<QToolBarAreaLayoutLine> *in_RDI;
  
  detach((QList<QToolBarAreaLayoutLine> *)0x6f837c);
  this_00 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)
            QArrayDataPointer<QToolBarAreaLayoutLine>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QToolBarAreaLayoutLine>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }